

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_PoolAllocator.h
# Opt level: O3

ProcessorInstanceRef * __thiscall
soul::PoolAllocator::
allocate<soul::AST::ProcessorInstanceRef,soul::AST::Context&,soul::pool_ref<soul::AST::ProcessorInstance>&>
          (PoolAllocator *this,Context *args,pool_ref<soul::AST::ProcessorInstance> *args_1)

{
  ProcessorInstance *pPVar1;
  SourceCodeText *pSVar2;
  Scope *pSVar3;
  PoolItem *pPVar4;
  
  pPVar4 = allocateSpaceForObject(this,0x38);
  pPVar1 = args_1->object;
  *(undefined4 *)&pPVar4->field_0x18 = 0x2e;
  pSVar2 = (args->location).sourceCode.object;
  pPVar4[1].size = (size_t)pSVar2;
  if (pSVar2 != (SourceCodeText *)0x0) {
    (pSVar2->super_RefCountedObject).refCount = (pSVar2->super_RefCountedObject).refCount + 1;
  }
  pSVar3 = args->parentScope;
  pPVar4[1].destructor = (DestructorFn *)(args->location).location.data;
  pPVar4[1].item = pSVar3;
  *(undefined4 *)&pPVar4[1].field_0x18 = 3;
  pPVar4->item = &PTR__ASTObject_002ccfd8;
  pPVar4[2].size = (size_t)pPVar1;
  pPVar4->destructor =
       allocate<soul::AST::ProcessorInstanceRef,_soul::AST::Context_&,_soul::pool_ref<soul::AST::ProcessorInstance>_&>
       ::anon_class_1_0_00000001::__invoke;
  return (ProcessorInstanceRef *)&pPVar4->item;
}

Assistant:

Type& allocate (Args&&... args)
    {
        static_assert (sizeof (Type) + itemHeaderSize <= sizeof (Pool::space), "Can't allocate a pool object bigger than the pool block size");
        auto& newItem = allocateSpaceForObject (sizeof (Type));
        auto newObject = new (std::addressof (newItem.item)) Type (std::forward<Args> (args)...);

        // NB: the constructor may throw, so we have to be careful not to register its destructor until afterwards
        if constexpr (! std::is_trivially_destructible<Type>::value)
            newItem.destructor = [] (void* t) { static_cast<Type*> (t)->~Type(); };

        return *newObject;
    }